

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O1

int memleak_cmp(avl_node *a,avl_node *b,void *aux)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (b[-2].right <= a[-2].right) {
    uVar1 = (uint)(b[-2].right < a[-2].right);
  }
  return uVar1;
}

Assistant:

int memleak_cmp(struct avl_node *a, struct avl_node *b, void *aux)
{
    struct memleak_item *aa, *bb;
    aa = _get_entry(a, struct memleak_item, avl);
    bb = _get_entry(b, struct memleak_item, avl);
    if (aa->addr < bb->addr) return -1;
    else if (aa->addr > bb->addr) return 1;
    else return 0;
}